

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

int Dch_DeriveChoiceCountReprs(Aig_Man_t *pAig)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)pAig->vObjs->nSize;
  if (lVar5 < 1) {
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    do {
      pvVar2 = pAig->vObjs->pArray[lVar6];
      if ((pvVar2 != (void *)0x0) && (pAig->pReprs != (Aig_Obj_t **)0x0)) {
        iVar1 = *(int *)((long)pvVar2 + 0x24);
        pAVar3 = pAig->pReprs[iVar1];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          if (iVar1 <= pAVar3->Id) {
            __assert_fail("pRepr->Id < pObj->Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                          ,0x54,"int Dch_DeriveChoiceCountReprs(Aig_Man_t *)");
          }
          iVar4 = iVar4 + 1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return iVar4;
}

Assistant:

int Dch_DeriveChoiceCountReprs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nReprs = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( pAig, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        nReprs++;
    }
    return nReprs;
}